

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSynchronizationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::ConcurrentAtomicCounterCase::deinit
          (ConcurrentAtomicCounterCase *this)

{
  ShaderProgram *pSVar1;
  int iVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ConcurrentAtomicCounterCase *this_local;
  
  if (this->m_counterBuffer != 0) {
    pRVar3 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
    iVar2 = (*pRVar3->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var,iVar2) + 0x438))(1,&this->m_counterBuffer);
    this->m_counterBuffer = 0;
  }
  if (this->m_intermediateResultBuffer != 0) {
    pRVar3 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
    iVar2 = (*pRVar3->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var_00,iVar2) + 0x438))(1,&this->m_intermediateResultBuffer);
    this->m_intermediateResultBuffer = 0;
  }
  pSVar1 = this->m_evenProgram;
  if (pSVar1 != (ShaderProgram *)0x0) {
    glu::ShaderProgram::~ShaderProgram(pSVar1);
    operator_delete(pSVar1,0xd0);
  }
  this->m_evenProgram = (ShaderProgram *)0x0;
  pSVar1 = this->m_oddProgram;
  if (pSVar1 != (ShaderProgram *)0x0) {
    glu::ShaderProgram::~ShaderProgram(pSVar1);
    operator_delete(pSVar1,0xd0);
  }
  this->m_oddProgram = (ShaderProgram *)0x0;
  return;
}

Assistant:

void ConcurrentAtomicCounterCase::deinit (void)
{
	if (m_counterBuffer)
	{
		m_context.getRenderContext().getFunctions().deleteBuffers(1, &m_counterBuffer);
		m_counterBuffer = 0;
	}
	if (m_intermediateResultBuffer)
	{
		m_context.getRenderContext().getFunctions().deleteBuffers(1, &m_intermediateResultBuffer);
		m_intermediateResultBuffer = 0;
	}

	delete m_evenProgram;
	m_evenProgram = DE_NULL;

	delete m_oddProgram;
	m_oddProgram = DE_NULL;
}